

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.hpp
# Opt level: O2

void __thiscall
nite::Program::Program(Program *this,int id,Uniform *uniforms,string *name,Shader *ref)

{
  (this->shaderName)._M_dataplus._M_p = (pointer)&(this->shaderName).field_2;
  (this->shaderName)._M_string_length = 0;
  (this->shaderName).field_2._M_local_buf[0] = '\0';
  Uniform::Uniform(&this->uniforms);
  this->id = id;
  Uniform::operator=(&this->uniforms,uniforms);
  std::__cxx11::string::_M_assign((string *)this);
  this->ref = ref;
  return;
}

Assistant:

Program(int id, Uniform uniforms, const String &name, nite::Shader *ref){
				this->id = id;
				this->uniforms = uniforms;
				this->shaderName = name;
				this->ref = ref;
			}